

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_exclude_vcs.c
# Opt level: O2

void test_option_exclude_vcs(void)

{
  wchar_t wVar1;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'\v',L'\0');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\f',"in",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'\r',"in");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x0e',"file",L'Ƥ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\x0f',"dir",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\x10',"CVS",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x11',"CVS/fileattr",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x12',".cvsignore",L'Ƥ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\x13',"RCS",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x14',"RCS/somefile",L'ƭ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\x15',"SCCS",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x16',"SCCS/somefile",L'ƭ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\x17',".svn",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x18',".svn/format",L'ƭ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\x19',".git",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x1a',".git/config",L'ƭ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x1b',".gitignore",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x1c',".gitattributes",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x1d',".gitmodules",L'Ƥ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\x1e',".arch-ids",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x1f',".arch-ids/somefile",L'Ƥ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L' ',"{arch}",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'!',"{arch}/somefile",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\"',"=RELEASE-ID",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'#',"=meta-update",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'$',"=update",L'Ƥ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'%',".bzr",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'&',".bzr/checkout",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\'',".bzrignore",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'(',".bzrtags",L'Ƥ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L')',".hg",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'*',".hg/dirstate",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'+',".hgignore",L'Ƥ',L'\xffffffff',"");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L',',".hgtags",L'Ƥ',L'\xffffffff',"");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'-',"_darcs",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'.',"_darcs/format",L'Ƥ',L'\xffffffff',"");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'/',"..");
  wVar1 = systemf("%s -c -C in -f included.tar .",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'1',0,"0",(long)wVar1,"systemf(\"%s -c -C in -f included.tar .\", testprog)"
                      ,(void *)0x0);
  wVar1 = systemf("%s -c --exclude-vcs -C in -f excluded.tar .",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'3',0,"0",(long)wVar1,
                      "systemf(\"%s -c --exclude-vcs -C in -f excluded.tar .\", testprog)",
                      (void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'6',"vcs-noexclude",L'ǭ');
  wVar1 = systemf("%s -x -C vcs-noexclude -f included.tar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'8',0,"0",(long)wVar1,
                      "systemf(\"%s -x -C vcs-noexclude -f included.tar\", testprog)",(void *)0x0);
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'9',"vcs-noexclude");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L':',"file");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L';',"dir",L'ǭ');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'<',"CVS",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'=',"CVS/fileattr");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'>',".cvsignore");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'?',"RCS",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'@',"RCS/somefile");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'A',"SCCS",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'B',"SCCS/somefile");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'C',".svn",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'D',".svn/format");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'E',".git",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'F',".git/config");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'G',".gitignore");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'H',".gitattributes");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'I',".gitmodules");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'J',".arch-ids",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'K',".arch-ids/somefile");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'L',"{arch}",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'M',"{arch}/somefile");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'N',"=RELEASE-ID");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'O',"=meta-update");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'P',"=update");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'Q',".bzr",L'ǭ');
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'R',".bzr/checkout",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'S',".bzrignore");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'T',".bzrtags");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'U',".hg",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'V',".hg/dirstate");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'W',".hgignore");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'X',".hgtags");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'Y',"_darcs",L'ǭ');
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Z',"_darcs/format");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'[',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'^',"vcs-exclude",L'ǭ');
  wVar1 = systemf("%s -x --exclude-vcs -C vcs-exclude -f included.tar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'`',0,"0",(long)wVar1,
                      "systemf(\"%s -x --exclude-vcs -C vcs-exclude -f included.tar\", testprog)",
                      (void *)0x0);
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'a',"vcs-exclude");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'b',"file");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'c',"dir",L'ǭ');
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'd',"CVS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'e',"CVS/fileattr");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'f',".cvsignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'g',"RCS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'h',"RCS/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'i',"SCCS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'j',"SCCS/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'k',".svn");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'l',".svn/format");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'm',".git");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'n',".git/config");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'o',".gitignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'p',".gitattributes");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'q',".gitmodules");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'r',".arch-ids");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L's',".arch-ids/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L't',"{arch}");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'u',"{arch}/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'v',"=RELEASE-ID");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'w',"=meta-update");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'x',"=update");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'y',".bzr");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'z',".bzr/checkout");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'{',".bzrignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'|',".bzrtags");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'}',".hg");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'~',".hg/dirstate");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x7f',".hgignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x80',".hgtags");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x81',"_darcs");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x82',"_darcs/format");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'\x83',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'\x86',"novcs-exclude",L'ǭ');
  wVar1 = systemf("%s -x --exclude-vcs -C novcs-exclude -f excluded.tar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'\x89',0,"0",(long)wVar1,
                      "systemf(\"%s -x --exclude-vcs -C novcs-exclude -f excluded.tar\", testprog)",
                      (void *)0x0);
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'\x8a',"novcs-exclude");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x8b',"file");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'\x8c',"dir",L'ǭ');
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x8d',"CVS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x8e',"CVS/fileattr");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x8f',".cvsignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x90',"RCS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x91',"RCS/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x92',"SCCS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x93',"SCCS/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x94',".svn");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x95',".svn/format");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x96',".git");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x97',".git/config");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x98',".gitignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x99',".gitattributes");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x9a',".gitmodules");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x9b',".arch-ids");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x9c',".arch-ids/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x9d',"{arch}");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x9e',"{arch}/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\x9f',"=RELEASE-ID");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'\xa0',"=meta-update");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¡',"=update");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¢',".bzr");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'£',".bzr/checkout");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¤',".bzrignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¥',".bzrtags");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¦',".hg");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'§',".hg/dirstate");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¨',".hgignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'©',".hgtags");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'ª',"_darcs");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'«',"_darcs/format");
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'¬',"..");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                     ,L'¯',"novcs-noexclude",L'ǭ');
  wVar1 = systemf("%s -x -C novcs-noexclude -f excluded.tar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                      ,L'±',0,"0",(long)wVar1,
                      "systemf(\"%s -x -C novcs-noexclude -f excluded.tar\", testprog)",(void *)0x0)
  ;
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                  ,L'²',"novcs-noexclude");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'³',"file");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
                   ,L'´',"dir",L'ǭ');
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'µ',"CVS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¶',"CVS/fileattr");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'·',".cvsignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¸',"RCS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¹',"RCS/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'º',"SCCS");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'»',"SCCS/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¼',".svn");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'½',".svn/format");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¾',".git");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'¿',".git/config");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'À',".gitignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Á',".gitattributes");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Â',".gitmodules");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ã',".arch-ids");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ä',".arch-ids/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Å',"{arch}");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Æ',"{arch}/somefile");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ç',"=RELEASE-ID");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'È',"=meta-update");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'É',"=update");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ê',".bzr");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ë',".bzr/checkout");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ì',".bzrignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Í',".bzrtags");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Î',".hg");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ï',".hg/dirstate");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ð',".hgignore");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ñ',".hgtags");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ò',"_darcs");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/tar/test/test_option_exclude_vcs.c"
             ,L'Ó',"_darcs/format");
  return;
}

Assistant:

DEFINE_TEST(test_option_exclude_vcs)
{
	assertUmask(0);
	assertMakeDir("in", 0755);
	assertChdir("in");
	assertMakeFile("file", 0644, "");
	assertMakeDir("dir", 0755);
	assertMakeDir("CVS", 0755);
	assertMakeFile("CVS/fileattr", 0644, "");
	assertMakeFile(".cvsignore", 0644, "");
	assertMakeDir("RCS", 0755);
	assertMakeFile("RCS/somefile", 0655, "");
	assertMakeDir("SCCS", 0755);
	assertMakeFile("SCCS/somefile", 0655, "");
	assertMakeDir(".svn", 0755);
	assertMakeFile(".svn/format", 0655, "");
	assertMakeDir(".git", 0755);
	assertMakeFile(".git/config", 0655, "");
	assertMakeFile(".gitignore", 0644, "");
	assertMakeFile(".gitattributes", 0644, "");
	assertMakeFile(".gitmodules", 0644, "");
	assertMakeDir(".arch-ids", 0755);
	assertMakeFile(".arch-ids/somefile", 0644, "");
	assertMakeDir("{arch}", 0755);
	assertMakeFile("{arch}/somefile", 0644, "");
	assertMakeFile("=RELEASE-ID", 0644, "");
	assertMakeFile("=meta-update", 0644, "");
	assertMakeFile("=update", 0644, "");
	assertMakeDir(".bzr", 0755);
	assertMakeDir(".bzr/checkout", 0755);
	assertMakeFile(".bzrignore", 0644, "");
	assertMakeFile(".bzrtags", 0644, "");
	assertMakeDir(".hg", 0755);
	assertMakeFile(".hg/dirstate", 0644, "");
	assertMakeFile(".hgignore", 0644, "");
	assertMakeFile(".hgtags", 0644, "");
	assertMakeDir("_darcs", 0755);
	assertMakeFile("_darcs/format", 0644, "");
	assertChdir("..");

	assertEqualInt(0, systemf("%s -c -C in -f included.tar .", testprog));
	assertEqualInt(0,
	    systemf("%s -c --exclude-vcs -C in -f excluded.tar .", testprog));

	/* No flags, archive with vcs files */
	assertMakeDir("vcs-noexclude", 0755);
	assertEqualInt(0, systemf("%s -x -C vcs-noexclude -f included.tar",
	    testprog));
	assertChdir("vcs-noexclude");
	assertFileExists("file");
	assertIsDir("dir", 0755);
	assertIsDir("CVS", 0755);
	assertFileExists("CVS/fileattr");
	assertFileExists(".cvsignore");
	assertIsDir("RCS", 0755);
	assertFileExists("RCS/somefile");
	assertIsDir("SCCS", 0755);
	assertFileExists("SCCS/somefile");
	assertIsDir(".svn", 0755);
	assertFileExists(".svn/format");
	assertIsDir(".git", 0755);
	assertFileExists(".git/config");
	assertFileExists(".gitignore");
	assertFileExists(".gitattributes");
	assertFileExists(".gitmodules");
	assertIsDir(".arch-ids", 0755);
	assertFileExists(".arch-ids/somefile");
	assertIsDir("{arch}", 0755);
	assertFileExists("{arch}/somefile");
	assertFileExists("=RELEASE-ID");
	assertFileExists("=meta-update");
	assertFileExists("=update");
	assertIsDir(".bzr", 0755);
	assertIsDir(".bzr/checkout", 0755);
	assertFileExists(".bzrignore");
	assertFileExists(".bzrtags");
	assertIsDir(".hg", 0755);
	assertFileExists(".hg/dirstate");
	assertFileExists(".hgignore");
	assertFileExists(".hgtags");
	assertIsDir("_darcs", 0755);
	assertFileExists("_darcs/format");
	assertChdir("..");

	/* --exclude-vcs, archive with vcs files */
	assertMakeDir("vcs-exclude", 0755);
	assertEqualInt(0,
	    systemf("%s -x --exclude-vcs -C vcs-exclude -f included.tar", testprog));
	assertChdir("vcs-exclude");
	assertFileExists("file");
	assertIsDir("dir", 0755);
	assertFileNotExists("CVS");
	assertFileNotExists("CVS/fileattr");
	assertFileNotExists(".cvsignore");
	assertFileNotExists("RCS");
	assertFileNotExists("RCS/somefile");
	assertFileNotExists("SCCS");
	assertFileNotExists("SCCS/somefile");
	assertFileNotExists(".svn");
	assertFileNotExists(".svn/format");
	assertFileNotExists(".git");
	assertFileNotExists(".git/config");
	assertFileNotExists(".gitignore");
	assertFileNotExists(".gitattributes");
	assertFileNotExists(".gitmodules");
	assertFileNotExists(".arch-ids");
	assertFileNotExists(".arch-ids/somefile");
	assertFileNotExists("{arch}");
	assertFileNotExists("{arch}/somefile");
	assertFileNotExists("=RELEASE-ID");
	assertFileNotExists("=meta-update");
	assertFileNotExists("=update");
	assertFileNotExists(".bzr");
	assertFileNotExists(".bzr/checkout");
	assertFileNotExists(".bzrignore");
	assertFileNotExists(".bzrtags");
	assertFileNotExists(".hg");
	assertFileNotExists(".hg/dirstate");
	assertFileNotExists(".hgignore");
	assertFileNotExists(".hgtags");
	assertFileNotExists("_darcs");
	assertFileNotExists("_darcs/format");
	assertChdir("..");

	/* --exclude-vcs, archive without vcs files */
	assertMakeDir("novcs-exclude", 0755);
	assertEqualInt(0,
	    systemf("%s -x --exclude-vcs -C novcs-exclude -f excluded.tar",
	    testprog));
	assertChdir("novcs-exclude");
	assertFileExists("file");
	assertIsDir("dir", 0755);
	assertFileNotExists("CVS");
	assertFileNotExists("CVS/fileattr");
	assertFileNotExists(".cvsignore");
	assertFileNotExists("RCS");
	assertFileNotExists("RCS/somefile");
	assertFileNotExists("SCCS");
	assertFileNotExists("SCCS/somefile");
	assertFileNotExists(".svn");
	assertFileNotExists(".svn/format");
	assertFileNotExists(".git");
	assertFileNotExists(".git/config");
	assertFileNotExists(".gitignore");
	assertFileNotExists(".gitattributes");
	assertFileNotExists(".gitmodules");
	assertFileNotExists(".arch-ids");
	assertFileNotExists(".arch-ids/somefile");
	assertFileNotExists("{arch}");
	assertFileNotExists("{arch}/somefile");
	assertFileNotExists("=RELEASE-ID");
	assertFileNotExists("=meta-update");
	assertFileNotExists("=update");
	assertFileNotExists(".bzr");
	assertFileNotExists(".bzr/checkout");
	assertFileNotExists(".bzrignore");
	assertFileNotExists(".bzrtags");
	assertFileNotExists(".hg");
	assertFileNotExists(".hg/dirstate");
	assertFileNotExists(".hgignore");
	assertFileNotExists(".hgtags");
	assertFileNotExists("_darcs");
	assertFileNotExists("_darcs/format");
	assertChdir("..");

	/* No flags, archive without vcs files */
	assertMakeDir("novcs-noexclude", 0755);
	assertEqualInt(0,
	    systemf("%s -x -C novcs-noexclude -f excluded.tar", testprog));
	assertChdir("novcs-noexclude");
	assertFileExists("file");
	assertIsDir("dir", 0755);
	assertFileNotExists("CVS");
	assertFileNotExists("CVS/fileattr");
	assertFileNotExists(".cvsignore");
	assertFileNotExists("RCS");
	assertFileNotExists("RCS/somefile");
	assertFileNotExists("SCCS");
	assertFileNotExists("SCCS/somefile");
	assertFileNotExists(".svn");
	assertFileNotExists(".svn/format");
	assertFileNotExists(".git");
	assertFileNotExists(".git/config");
	assertFileNotExists(".gitignore");
	assertFileNotExists(".gitattributes");
	assertFileNotExists(".gitmodules");
	assertFileNotExists(".arch-ids");
	assertFileNotExists(".arch-ids/somefile");
	assertFileNotExists("{arch}");
	assertFileNotExists("{arch}/somefile");
	assertFileNotExists("=RELEASE-ID");
	assertFileNotExists("=meta-update");
	assertFileNotExists("=update");
	assertFileNotExists(".bzr");
	assertFileNotExists(".bzr/checkout");
	assertFileNotExists(".bzrignore");
	assertFileNotExists(".bzrtags");
	assertFileNotExists(".hg");
	assertFileNotExists(".hg/dirstate");
	assertFileNotExists(".hgignore");
	assertFileNotExists(".hgtags");
	assertFileNotExists("_darcs");
	assertFileNotExists("_darcs/format");
}